

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::ValidateMessageOptions
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ExtensionRange *pEVar5;
  Descriptor *in_RDX;
  DescriptorBuilder *in_RSI;
  string *in_RDI;
  int i_4;
  int64 max_extension_range;
  int i_3;
  int i_2;
  int i_1;
  int i;
  SubstituteArg *in_stack_fffffffffffffcc8;
  DescriptorProto *in_stack_fffffffffffffcd0;
  FieldDescriptorProto *in_stack_fffffffffffffd10;
  FieldDescriptor *in_stack_fffffffffffffd18;
  DescriptorBuilder *in_stack_fffffffffffffd20;
  SubstituteArg *arg2;
  SubstituteArg *this_00;
  SubstituteArg *this_01;
  SubstituteArg *this_02;
  SubstituteArg *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  int iVar6;
  SubstituteArg *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  SubstituteArg *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  ErrorLocation in_stack_fffffffffffffdac;
  Message *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  DescriptorBuilder *in_stack_fffffffffffffdc0;
  SubstituteArg local_218;
  EnumDescriptorProto *in_stack_fffffffffffffe40;
  EnumDescriptor *in_stack_fffffffffffffe48;
  DescriptorBuilder *in_stack_fffffffffffffe50;
  undefined1 local_188 [96];
  SubstituteArg local_128;
  SubstituteArg local_f8;
  SubstituteArg local_c8;
  SubstituteArg local_98;
  string local_68 [36];
  int local_44;
  long local_40;
  int local_38;
  int local_34;
  int iVar7;
  
  iVar7 = 0;
  while( true ) {
    iVar6 = iVar7;
    iVar2 = Descriptor::field_count((Descriptor *)in_RSI);
    if (iVar2 <= iVar7) break;
    in_stack_fffffffffffffd90 =
         (SubstituteArg *)
         ((long)(in_RSI->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + (long)iVar6 * 0x98);
    DescriptorProto::field
              (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    ValidateFieldOptions
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    iVar7 = iVar6 + 1;
  }
  iVar2 = 0;
  while( true ) {
    iVar4 = iVar2;
    iVar3 = Descriptor::nested_type_count((Descriptor *)in_RSI);
    if (iVar3 <= iVar2) break;
    in_stack_fffffffffffffd80 = (SubstituteArg *)(*(long *)&in_RSI->filename_ + (long)iVar4 * 0x90);
    DescriptorProto::nested_type
              (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    ValidateMessageOptions(in_RSI,in_RDX,(DescriptorProto *)CONCAT44(iVar6,iVar4));
    iVar2 = iVar4 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar6 = local_34;
    iVar4 = Descriptor::enum_type_count((Descriptor *)in_RSI);
    if (iVar4 <= iVar6) break;
    in_stack_fffffffffffffd70 =
         (SubstituteArg *)((in_RSI->filename_)._M_string_length + (long)local_34 * 0x50);
    DescriptorProto::enum_type
              (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    ValidateEnumOptions(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                        in_stack_fffffffffffffe40);
    local_34 = local_34 + 1;
  }
  local_38 = 0;
  while( true ) {
    iVar4 = local_38;
    iVar3 = Descriptor::extension_count((Descriptor *)in_RSI);
    if (iVar3 <= iVar4) break;
    DescriptorProto::extension
              (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
    ValidateFieldOptions
              (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    local_38 = local_38 + 1;
  }
  Descriptor::options((Descriptor *)in_RSI);
  bVar1 = MessageOptions::message_set_wire_format((MessageOptions *)0x4c7e00);
  iVar4 = 0x1fffffff;
  if (bVar1) {
    iVar4 = 0x7fffffff;
  }
  local_40 = (long)iVar4;
  local_44 = 0;
  while( true ) {
    iVar4 = local_44;
    iVar3 = Descriptor::extension_range_count((Descriptor *)in_RSI);
    if (iVar3 <= iVar4) break;
    pEVar5 = Descriptor::extension_range((Descriptor *)in_RSI,local_44);
    if (local_40 + 1 < (long)pEVar5->end) {
      Descriptor::full_name_abi_cxx11_((Descriptor *)in_RSI);
      DescriptorProto::extension_range
                (in_stack_fffffffffffffcd0,(int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
      arg2 = &local_98;
      strings::internal::SubstituteArg::SubstituteArg
                ((SubstituteArg *)in_stack_fffffffffffffcd0,(long)in_stack_fffffffffffffcc8);
      this_00 = &local_c8;
      strings::internal::SubstituteArg::SubstituteArg(this_00);
      this_01 = &local_f8;
      strings::internal::SubstituteArg::SubstituteArg(this_01);
      this_02 = &local_128;
      strings::internal::SubstituteArg::SubstituteArg(this_02);
      in_stack_fffffffffffffcc8 = (SubstituteArg *)(local_188 + 0x30);
      strings::internal::SubstituteArg::SubstituteArg(in_stack_fffffffffffffcc8);
      in_stack_fffffffffffffcd0 = (DescriptorProto *)local_188;
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)in_stack_fffffffffffffcd0);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffffe48);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffffe18);
      strings::internal::SubstituteArg::SubstituteArg(&local_218);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&stack0xfffffffffffffdb8);
      strings::Substitute_abi_cxx11_
                ((char *)this_02,this_01,this_00,arg2,in_stack_fffffffffffffcc8,
                 in_stack_fffffffffffffd70,
                 (SubstituteArg *)CONCAT44(iVar6,in_stack_fffffffffffffd78),
                 in_stack_fffffffffffffd80,
                 (SubstituteArg *)CONCAT44(iVar2,in_stack_fffffffffffffd88),
                 in_stack_fffffffffffffd90,
                 (SubstituteArg *)CONCAT44(iVar7,in_stack_fffffffffffffd98));
      AddError(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
               in_stack_fffffffffffffdac,in_RDI);
      std::__cxx11::string::~string(local_68);
    }
    local_44 = local_44 + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateMessageOptions(Descriptor* message,
                                               const DescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(message, field, Field);
  VALIDATE_OPTIONS_FROM_ARRAY(message, nested_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(message, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(message, extension, Field);

  const int64 max_extension_range =
      static_cast<int64>(message->options().message_set_wire_format()
                             ? kint32max
                             : FieldDescriptor::kMaxNumber);
  for (int i = 0; i < message->extension_range_count(); ++i) {
    if (message->extension_range(i)->end > max_extension_range + 1) {
      AddError(
          message->full_name(), proto.extension_range(i),
          DescriptorPool::ErrorCollector::NUMBER,
          strings::Substitute("Extension numbers cannot be greater than $0.",
                              max_extension_range));
    }
  }
}